

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

ssize_t __thiscall
booster::locale::basic_message<wchar_t>::write
          (basic_message<wchar_t> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  message_format<wchar_t> *pmVar2;
  pointer pwVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  pointer pwVar5;
  pointer pwVar6;
  
  pwVar6 = this->c_id_;
  if (pwVar6 == (pointer)0x0) {
    pwVar6 = (this->id_)._M_dataplus._M_p;
  }
  pwVar3 = (pointer)(this->context_)._M_string_length;
  if (pwVar3 != (pointer)0x0) {
    pwVar3 = (this->context_)._M_dataplus._M_p;
  }
  if (this->c_context_ != (pointer)0x0) {
    pwVar3 = this->c_context_;
  }
  pwVar5 = (pointer)(this->plural_)._M_string_length;
  if (pwVar5 != (pointer)0x0) {
    pwVar5 = (this->plural_)._M_dataplus._M_p;
  }
  if (this->c_plural_ != (pointer)0x0) {
    pwVar5 = this->c_plural_;
  }
  if (*pwVar6 == L'\0') {
    pwVar3 = write::empty_string;
  }
  else {
    bVar1 = std::has_facet<booster::locale::message_format<wchar_t>>
                      ((locale *)CONCAT44(in_register_00000034,__fd));
    if (bVar1) {
      pmVar2 = std::use_facet<booster::locale::message_format<wchar_t>>
                         ((locale *)CONCAT44(in_register_00000034,__fd));
      if (pwVar5 == (pointer)0x0) {
        pwVar3 = (pointer)(**(code **)(*(long *)pmVar2 + 0x10))
                                    (pmVar2,(ulong)__buf & 0xffffffff,pwVar3,pwVar6);
      }
      else {
        pwVar3 = (pointer)(**(code **)(*(long *)pmVar2 + 0x18))
                                    (pmVar2,(ulong)__buf & 0xffffffff,pwVar3,pwVar6,this->n_);
      }
      if (pwVar3 == (pointer)0x0) {
        pwVar3 = pwVar5;
        if (this->n_ == 1) {
          pwVar3 = pwVar6;
        }
        if (pwVar5 == (pointer)0x0) {
          pwVar3 = pwVar6;
        }
        sVar4 = (**(code **)(*(long *)pmVar2 + 0x28))(pmVar2,pwVar3,__n);
        return sVar4;
      }
    }
    else {
      pwVar3 = pwVar5;
      if (this->n_ == 1) {
        pwVar3 = pwVar6;
      }
      if (pwVar5 == (pointer)0x0) {
        pwVar3 = pwVar6;
      }
    }
  }
  return (ssize_t)pwVar3;
}

Assistant:

char_type const *write(std::locale const &loc,int domain_id,string_type &buffer) const
            {
                char_type const *translated = 0;
                static const char_type empty_string[1] = {0};

                char_type const *id = this->id();
                char_type const *context = this->context();
                char_type const *plural = this->plural();
                
                if(*id == 0)
                    return empty_string;
                
                facet_type const *facet = 0;
                if(std::has_facet<facet_type>(loc))
                    facet = &std::use_facet<facet_type>(loc);

                if(facet) { 
                    if(!plural) {
                        translated = facet->get(domain_id,context,id);
                    }
                    else {
                        translated = facet->get(domain_id,context,id,n_);
                    }
                }

                if(!translated) {
                    char_type const *msg = plural ? ( n_ == 1 ? id : plural) : id;

                    if(facet) {
                        translated = facet->convert(msg,buffer);
                    }
                    else {
                        translated = details::string_cast_traits<char_type>::cast(msg,buffer);
                    }
                }
                return translated;
            }